

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlru_cache.hpp
# Opt level: O1

void __thiscall
cappuccino::tlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::do_update
          (tlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1> *this,
          iterator keyed_position,unsigned_long *value,time_point expire_time)

{
  unsigned_long uVar1;
  long lVar2;
  iterator iVar3;
  __off64_t *in_R8;
  size_t in_R9;
  size_t element_idx;
  uint in_stack_ffffffffffffffb8;
  unsigned_long local_40;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  
  uVar1 = *(unsigned_long *)
           ((long)keyed_position.
                  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                  _M_cur + 0x10);
  lVar2 = *(long *)(this + 0x30);
  ((duration *)(lVar2 + uVar1 * 0x28))->__r = (rep)expire_time.__d.__r;
  *(unsigned_long *)(lVar2 + 0x20 + uVar1 * 0x28) = *value;
  local_40 = uVar1;
  local_38.__d.__r = expire_time.__d.__r;
  std::
  _Rb_tree<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>,std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>>
  ::erase_abi_cxx11_((_Rb_tree<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>,std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>>
                      *)(this + 0x98),*(_Base_ptr *)(lVar2 + 0x18 + uVar1 * 0x28));
  iVar3 = std::
          _Rb_tree<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>,std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>>
          ::
          _M_emplace_equal<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>&,unsigned_long&>
                    ((_Rb_tree<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>,std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>>
                      *)(this + 0x98),&local_38,&local_40);
  *(_Base_ptr *)(lVar2 + 0x18 + uVar1 * 0x28) = iVar3._M_node;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::splice
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x80),
             (int)*(undefined8 *)(this + 0x80),(__off64_t *)(this + 0x80),
             (int)*(undefined8 *)(lVar2 + 0x10 + uVar1 * 0x28),in_R8,in_R9,in_stack_ffffffffffffffb8
            );
  return;
}

Assistant:

auto do_update(
        typename std::unordered_map<key_type, size_t>::iterator keyed_position,
        value_type&&                                            value,
        std::chrono::steady_clock::time_point                   expire_time) -> void
    {
        size_t element_idx = keyed_position->second;

        element& e      = m_elements[element_idx];
        e.m_expire_time = expire_time;
        e.m_value       = std::move(value);

        // Reinsert into TTL list with the new TTL.
        m_ttl_list.erase(e.m_ttl_position);
        e.m_ttl_position = m_ttl_list.emplace(expire_time, element_idx);

        do_access(e);
    }